

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NewtIO.c
# Opt level: O1

int NIOVfprintf(newtStream_t *stream,char *format,__va_list_tag *ap)

{
  _Bool _Var1;
  uint uVar2;
  int iVar3;
  char wk [255];
  char acStack_128 [254];
  undefined1 local_2a;
  
  _Var1 = NewtRefIsString(stream->obj);
  if (_Var1) {
    uVar2 = vsnprintf(acStack_128,0xff,format,ap);
    if (0 < (int)uVar2) {
      if (0xff < uVar2) {
        local_2a = 0;
      }
      NewtStrCat(stream->obj,acStack_128);
    }
    return uVar2;
  }
  iVar3 = vfprintf((FILE *)stream->file,format,ap);
  return iVar3;
}

Assistant:

int NIOVfprintf(newtStream_t * stream, const char * format, va_list ap)
{
    int		result = 0;
    
    if (NewtRefIsString(stream->obj))
    {
        char	wk[NEWT_SNPRINTF_BUFFSIZE];
        
        result = vsnprintf(wk, sizeof(wk), format, ap);
        
        if (0 < result)
        {
            if (sizeof(wk) < result)
                wk[sizeof(wk) - 1] = '\0';
            
            NewtStrCat(stream->obj, wk);
        }
    }
    else
    {
        result = vfprintf(stream->file, format, ap);
    }
    
    return result;
}